

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacroCommand.cpp
# Opt level: O2

void __thiscall MacroCommand::Execute(MacroCommand *this)

{
  Command *pCVar1;
  ListIterator<Command_*> local_20;
  
  local_20._list = *(List<Command_*> **)(this + 8);
  local_20.super_Iterator<Command_*>._vptr_Iterator = (_func_int **)&PTR_First_00104d38;
  for (local_20._current = 0; local_20._current < *(long *)(local_20._list + 0x10);
      local_20._current = local_20._current + 1) {
    pCVar1 = ListIterator<Command_*>::CurrentItem(&local_20);
    (*pCVar1->_vptr_Command[2])(pCVar1);
  }
  return;
}

Assistant:

void MacroCommand::Execute()
{
    ListIterator<Command*> i(_cmds);

    for (i.First(); !i.IsDone(); i.Next())
    {
        Command* c = i.CurrentItem();
        c->Execute();
    }
}